

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t ismode_w(wchar_t *start,wchar_t *end,wchar_t *permset)

{
  uint uVar1;
  ulong uVar2;
  
  if (end <= start) {
    return L'\0';
  }
  *permset = L'\0';
  do {
    uVar1 = *start + L'\xffffffae';
    uVar2 = (ulong)uVar1;
    if (uVar1 < 0x27) {
      if ((0x100000001U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x2000000020U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x4000000040U >> (uVar2 & 0x3f) & 1) == 0) goto LAB_00690bd5;
          uVar1 = 1;
        }
        else {
          uVar1 = 2;
        }
      }
      else {
        uVar1 = 4;
      }
      *permset = *permset | uVar1;
    }
    else {
LAB_00690bd5:
      if (*start != L'-') {
        return L'\0';
      }
    }
    start = start + 1;
    if (end <= start) {
      return L'\x01';
    }
  } while( true );
}

Assistant:

static int
ismode_w(const wchar_t *start, const wchar_t *end, int *permset)
{
	const wchar_t *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case L'r': case L'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case L'w': case L'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case L'x': case L'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case L'-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}